

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_eq_quiet_ppc(float128 a,float128 b,float_status *status)

{
  int32_t iVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool local_4b;
  bool local_4a;
  bool local_49;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  iVar1 = extractFloat128Exp(a);
  if (iVar1 == 0x7fff) {
    uVar3 = extractFloat128Frac0(a);
    uVar4 = extractFloat128Frac1(a);
    if (uVar3 == 0 && uVar4 == 0) goto LAB_00eae2be;
LAB_00eae300:
    iVar2 = float128_is_signaling_nan_ppc(a,status);
    if ((iVar2 != 0) || (iVar2 = float128_is_signaling_nan_ppc(b,status), iVar2 != 0)) {
      float_raise_ppc('\x01',status);
    }
    a_local.high._4_4_ = 0;
  }
  else {
LAB_00eae2be:
    iVar1 = extractFloat128Exp(b);
    if (iVar1 == 0x7fff) {
      uVar3 = extractFloat128Frac0(b);
      uVar4 = extractFloat128Frac1(b);
      if (uVar3 != 0 || uVar4 != 0) goto LAB_00eae300;
    }
    local_49 = false;
    if (a.low == b.low) {
      local_4a = true;
      if (a.high != b.high) {
        local_4b = a.low == 0 && ((a.high | b.high) & 0x7fffffffffffffff) == 0;
        local_4a = local_4b;
      }
      local_49 = local_4a;
    }
    a_local.high._4_4_ = (uint)local_49;
  }
  return a_local.high._4_4_;
}

Assistant:

int float128_eq_quiet(float128 a, float128 b, float_status *status)
{

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    return
           ( a.low == b.low )
        && (    ( a.high == b.high )
             || (    ( a.low == 0 )
                  && ( (uint64_t) ( ( a.high | b.high )<<1 ) == 0 ) )
           );

}